

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

SASL_INIT_HANDLE sasl_init_clone(SASL_INIT_HANDLE value)

{
  SASL_INIT_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (SASL_INIT_HANDLE)malloc(8);
  if (__ptr != (SASL_INIT_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (SASL_INIT_HANDLE)0x0;
}

Assistant:

SASL_INIT_HANDLE sasl_init_clone(SASL_INIT_HANDLE value)
{
    SASL_INIT_INSTANCE* sasl_init_instance = (SASL_INIT_INSTANCE*)malloc(sizeof(SASL_INIT_INSTANCE));
    if (sasl_init_instance != NULL)
    {
        sasl_init_instance->composite_value = amqpvalue_clone(((SASL_INIT_INSTANCE*)value)->composite_value);
        if (sasl_init_instance->composite_value == NULL)
        {
            free(sasl_init_instance);
            sasl_init_instance = NULL;
        }
    }

    return sasl_init_instance;
}